

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::MhsWriter::Flush(MhsWriter *this,int transportIndex)

{
  bool bVar1;
  uint in_ESI;
  long in_RDI;
  Engine **e;
  iterator __end2;
  iterator __begin2;
  vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *__range2;
  vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
  local_20;
  long local_18;
  uint local_c;
  
  local_18 = in_RDI + 0xd8;
  local_c = in_ESI;
  local_20._M_current =
       (Engine **)
       std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
          *)__gnu_cxx::
            __normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
            ::operator*(&local_20);
    (*((Engine *)in_stack_ffffffffffffffd0->_M_current)->_vptr_Engine[9])
              ((Engine *)in_stack_ffffffffffffffd0->_M_current,(ulong)local_c);
    __gnu_cxx::
    __normal_iterator<adios2::core::Engine_**,_std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void MhsWriter::Flush(const int transportIndex)
{
    for (auto &e : m_SubEngines)
    {
        e->Flush(transportIndex);
    }
}